

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::SliderBehaviorT<long_long,long_long,double>
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,longlong *v,longlong v_min,
               longlong v_max,char *format,float power,ImGuiSliderFlags flags,ImRect *out_grab_bb)

{
  float fVar1;
  bool bVar2;
  ImGuiContext *pIVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  longlong lVar8;
  undefined *v_00;
  ImGuiDataType data_type_00;
  long lVar9;
  undefined8 unaff_RBX;
  uint uVar10;
  ulong uVar11;
  bool bVar12;
  bool bVar13;
  uint uVar14;
  double dVar15;
  double dVar16;
  ImVec2 IVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float local_88;
  
  pIVar3 = GImGui;
  uVar11 = (ulong)(flags & 1);
  uVar10 = data_type & 0xfffffffe;
  bVar12 = uVar10 == 8;
  bVar13 = power != 1.0;
  v_00 = (undefined *)CONCAT71((int7)((ulong)v >> 8),NAN(power));
  uVar5 = v_min - v_max;
  uVar6 = -uVar5;
  if (0 < (long)uVar5) {
    uVar6 = uVar5;
  }
  fVar20 = (&(bb->Min).x)[uVar11];
  fVar1 = (&(bb->Max).x)[uVar11];
  fVar21 = (fVar1 - fVar20) + -4.0;
  fVar19 = (GImGui->Style).GrabMinSize;
  if (uVar10 != 8) {
    fVar18 = fVar21 / (float)(long)(uVar6 + 1);
    uVar14 = -(uint)(fVar19 <= fVar18);
    fVar19 = (float)(~uVar14 & (uint)fVar19 | (uint)fVar18 & uVar14);
  }
  if (fVar21 <= fVar19) {
    fVar19 = fVar21;
  }
  if (v_max * v_min < 0 && (bVar13 && bVar12)) {
    dVar15 = (double)v_min;
    if (v_min < 0) {
      dVar15 = -dVar15;
    }
    dVar15 = pow(dVar15,1.0 / (double)power);
    dVar16 = (double)v_max;
    if (v_max < 0) {
      dVar16 = -dVar16;
    }
    dVar16 = pow(dVar16,1.0 / (double)power);
    fVar18 = (float)(dVar15 / (dVar16 + dVar15));
  }
  else if (v_min < 0) {
    fVar18 = 1.0;
  }
  else {
    fVar18 = 0.0;
  }
  fVar20 = fVar20 + 2.0 + fVar19 * 0.5;
  if (pIVar3->ActiveId != id) {
    bVar13 = false;
    goto LAB_0014dc8d;
  }
  if (pIVar3->ActiveIdSource == ImGuiInputSource_Nav) {
    IVar17 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.0,0.0);
    fVar23 = IVar17.x;
    if (uVar11 != 0) {
      fVar23 = -IVar17.y;
    }
    if ((pIVar3->NavActivatePressedId == id) && (pIVar3->ActiveIdIsJustActivated == false)) {
      ClearActiveID();
    }
    else if ((fVar23 != 0.0) || (NAN(fVar23))) {
      v_00 = (undefined *)v_max;
      fVar22 = SliderCalcRatioFromValueT<long_long,double>(data_type,*v,v_min,v_max,power,fVar18);
      if (uVar10 == 8) {
        iVar4 = ImParseFormatPrecision(format,3);
        v_00 = (undefined *)
               (CONCAT71((int7)((ulong)unaff_RBX >> 8),~(bVar13 && bVar12)) & 0xffffffff);
        if ((~(bVar13 && bVar12) & iVar4 < 1) != 0) goto LAB_0014d9ff;
        fVar23 = fVar23 / 100.0;
        if (0.0 < (GImGui->IO).NavInputs[0xe]) {
          fVar23 = fVar23 / 10.0;
        }
      }
      else {
LAB_0014d9ff:
        if ((uVar6 < 0x65) || (0.0 < (GImGui->IO).NavInputs[0xe])) {
          v_00 = &DAT_0016a6d8;
          fVar23 = *(float *)(&DAT_0016a6d8 + (ulong)(fVar23 < 0.0) * 4) / (float)(long)uVar6;
        }
        else {
          fVar23 = fVar23 / 100.0;
        }
      }
      uVar14 = -(uint)(0.0 < (GImGui->IO).NavInputs[0xf]);
      fVar23 = (float)(~uVar14 & (uint)fVar23 | (uint)(fVar23 * 10.0) & uVar14);
      if ((fVar22 < 1.0) || (fVar23 <= 0.0)) {
        if ((0.0 < fVar22) || (0.0 <= fVar23)) {
          fVar22 = fVar22 + fVar23;
          fVar23 = 1.0;
          if (fVar22 <= 1.0) {
            fVar23 = fVar22;
          }
          fVar22 = (float)(~-(uint)(fVar22 < 0.0) & (uint)fVar23);
          goto LAB_0014d8ba;
        }
        bVar2 = false;
      }
      else {
        bVar2 = false;
      }
      goto LAB_0014db06;
    }
    fVar22 = 0.0;
    bVar2 = false;
  }
  else {
    fVar22 = 0.0;
    if (pIVar3->ActiveIdSource == ImGuiInputSource_Mouse) {
      if ((pIVar3->IO).MouseDown[0] != false) {
        if (0.0 < fVar21 - fVar19) {
          fVar23 = (*(float *)((pIVar3->IO).MouseDown + uVar11 * 4 + -8) - fVar20) /
                   (fVar21 - fVar19);
          fVar22 = 1.0;
          if (fVar23 <= 1.0) {
            fVar22 = fVar23;
          }
          fVar22 = (float)(~-(uint)(fVar23 < 0.0) & (uint)fVar22);
        }
        if (uVar11 != 0) {
          fVar22 = 1.0 - fVar22;
        }
LAB_0014d8ba:
        bVar2 = true;
        goto LAB_0014db06;
      }
      ClearActiveID();
    }
    fVar22 = 0.0;
    bVar2 = false;
  }
LAB_0014db06:
  if (bVar2) {
    if (bVar13 && bVar12) {
      if (fVar18 <= fVar22) {
        uVar10 = -(uint)(1e-06 < ABS(fVar18 + -1.0));
        fVar23 = powf((float)(~uVar10 & (uint)fVar22 |
                             (uint)((fVar22 - fVar18) / (1.0 - fVar18)) & uVar10),power);
        uVar6 = 0;
        lVar8 = v_max;
        if (0 < v_min) {
          uVar6 = v_min;
        }
      }
      else {
        fVar23 = powf(1.0 - fVar22 / fVar18,power);
        uVar6 = v_max >> 0x3f & v_max;
        lVar8 = v_min;
      }
      v_00 = (undefined *)(lVar8 - uVar6);
      data_type_00 = (ImGuiDataType)(long)((float)(long)v_00 * fVar23 + (float)(long)uVar6);
    }
    else if (uVar10 == 8) {
      data_type_00 = (ImGuiDataType)(long)((float)(v_max - v_min) * fVar22 + (float)v_min);
    }
    else {
      fVar22 = fVar22 * (float)(v_max - v_min);
      lVar7 = (long)fVar22;
      lVar9 = (long)(fVar22 + 0.5);
      if (lVar9 < lVar7) {
        lVar9 = lVar7;
      }
      data_type_00 = (int)lVar9 + (int)v_min;
    }
    lVar8 = RoundScalarWithFormatT<long_long,long_long>
                      ((ImGui *)format,(char *)(ulong)(uint)data_type,data_type_00,(longlong)v_00);
    bVar13 = *v != lVar8;
    if (bVar13) {
      *v = lVar8;
      bVar13 = true;
    }
  }
  else {
    bVar13 = false;
  }
LAB_0014dc8d:
  if (1.0 <= fVar21) {
    local_88 = -fVar19;
    fVar21 = SliderCalcRatioFromValueT<long_long,double>(data_type,*v,v_min,v_max,power,fVar18);
    if (uVar11 != 0) {
      fVar21 = 1.0 - fVar21;
    }
    fVar20 = (((fVar1 + -2.0) - fVar19 * 0.5) - fVar20) * fVar21 + fVar20;
    if (uVar11 == 0) {
      fVar1 = (bb->Min).y;
      fVar21 = (bb->Max).y;
      (out_grab_bb->Min).x = local_88 * 0.5 + fVar20;
      (out_grab_bb->Min).y = fVar1 + 2.0;
      (out_grab_bb->Max).x = fVar19 * 0.5 + fVar20;
      (out_grab_bb->Max).y = fVar21 + -2.0;
    }
    else {
      fVar1 = (bb->Max).x;
      (out_grab_bb->Min).x = (bb->Min).x + 2.0;
      (out_grab_bb->Min).y = local_88 * 0.5 + fVar20;
      (out_grab_bb->Max).x = fVar1 + -2.0;
      (out_grab_bb->Max).y = fVar19 * 0.5 + fVar20;
    }
  }
  else {
    IVar17 = bb->Min;
    out_grab_bb->Min = IVar17;
    out_grab_bb->Max = IVar17;
  }
  return bVar13;
}

Assistant:

bool ImGui::SliderBehaviorT(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, TYPE* v, const TYPE v_min, const TYPE v_max, const char* format, float power, ImGuiSliderFlags flags, ImRect* out_grab_bb)
{
    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool is_power = (power != 1.0f) && is_decimal;

    const float grab_padding = 2.0f;
    const float slider_sz = (bb.Max[axis] - bb.Min[axis]) - grab_padding * 2.0f;
    float grab_sz = style.GrabMinSize;
    SIGNEDTYPE v_range = (v_min < v_max ? v_max - v_min : v_min - v_max);
    if (!is_decimal && v_range >= 0)                                             // v_range < 0 may happen on integer overflows
        grab_sz = ImMax((float)(slider_sz / (v_range + 1)), style.GrabMinSize);  // For integer sliders: if possible have the grab size represent 1 unit
    grab_sz = ImMin(grab_sz, slider_sz);
    const float slider_usable_sz = slider_sz - grab_sz;
    const float slider_usable_pos_min = bb.Min[axis] + grab_padding + grab_sz * 0.5f;
    const float slider_usable_pos_max = bb.Max[axis] - grab_padding - grab_sz * 0.5f;

    // For power curve sliders that cross over sign boundary we want the curve to be symmetric around 0.0f
    float linear_zero_pos;   // 0.0->1.0f
    if (is_power && v_min * v_max < 0.0f)
    {
        // Different sign
        const FLOATTYPE linear_dist_min_to_0 = ImPow(v_min >= 0 ? (FLOATTYPE)v_min : -(FLOATTYPE)v_min, (FLOATTYPE)1.0f / power);
        const FLOATTYPE linear_dist_max_to_0 = ImPow(v_max >= 0 ? (FLOATTYPE)v_max : -(FLOATTYPE)v_max, (FLOATTYPE)1.0f / power);
        linear_zero_pos = (float)(linear_dist_min_to_0 / (linear_dist_min_to_0 + linear_dist_max_to_0));
    }
    else
    {
        // Same sign
        linear_zero_pos = v_min < 0.0f ? 1.0f : 0.0f;
    }

    // Process interacting with the slider
    bool value_changed = false;
    if (g.ActiveId == id)
    {
        bool set_new_value = false;
        float clicked_t = 0.0f;
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (!g.IO.MouseDown[0])
            {
                ClearActiveID();
            }
            else
            {
                const float mouse_abs_pos = g.IO.MousePos[axis];
                clicked_t = (slider_usable_sz > 0.0f) ? ImClamp((mouse_abs_pos - slider_usable_pos_min) / slider_usable_sz, 0.0f, 1.0f) : 0.0f;
                if (axis == ImGuiAxis_Y)
                    clicked_t = 1.0f - clicked_t;
                set_new_value = true;
            }
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            const ImVec2 delta2 = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 0.0f, 0.0f);
            float delta = (axis == ImGuiAxis_X) ? delta2.x : -delta2.y;
            if (g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            {
                ClearActiveID();
            }
            else if (delta != 0.0f)
            {
                clicked_t = SliderCalcRatioFromValueT<TYPE,FLOATTYPE>(data_type, *v, v_min, v_max, power, linear_zero_pos);
                const int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 0;
                if ((decimal_precision > 0) || is_power)
                {
                    delta /= 100.0f;    // Gamepad/keyboard tweak speeds in % of slider bounds
                    if (IsNavInputDown(ImGuiNavInput_TweakSlow))
                        delta /= 10.0f;
                }
                else
                {
                    if ((v_range >= -100.0f && v_range <= 100.0f) || IsNavInputDown(ImGuiNavInput_TweakSlow))
                        delta = ((delta < 0.0f) ? -1.0f : +1.0f) / (float)v_range; // Gamepad/keyboard tweak speeds in integer steps
                    else
                        delta /= 100.0f;
                }
                if (IsNavInputDown(ImGuiNavInput_TweakFast))
                    delta *= 10.0f;
                set_new_value = true;
                if ((clicked_t >= 1.0f && delta > 0.0f) || (clicked_t <= 0.0f && delta < 0.0f)) // This is to avoid applying the saturation when already past the limits
                    set_new_value = false;
                else
                    clicked_t = ImSaturate(clicked_t + delta);
            }
        }

        if (set_new_value)
        {
            TYPE v_new;
            if (is_power)
            {
                // Account for power curve scale on both sides of the zero
                if (clicked_t < linear_zero_pos)
                {
                    // Negative: rescale to the negative range before powering
                    float a = 1.0f - (clicked_t / linear_zero_pos);
                    a = ImPow(a, power);
                    v_new = ImLerp(ImMin(v_max, (TYPE)0), v_min, a);
                }
                else
                {
                    // Positive: rescale to the positive range before powering
                    float a;
                    if (ImFabs(linear_zero_pos - 1.0f) > 1.e-6f)
                        a = (clicked_t - linear_zero_pos) / (1.0f - linear_zero_pos);
                    else
                        a = clicked_t;
                    a = ImPow(a, power);
                    v_new = ImLerp(ImMax(v_min, (TYPE)0), v_max, a);
                }
            }
            else
            {
                // Linear slider
                if (is_decimal)
                {
                    v_new = ImLerp(v_min, v_max, clicked_t);
                }
                else
                {
                    // For integer values we want the clicking position to match the grab box so we round above
                    // This code is carefully tuned to work with large values (e.g. high ranges of U64) while preserving this property..
                    FLOATTYPE v_new_off_f = (v_max - v_min) * clicked_t;
                    TYPE v_new_off_floor = (TYPE)(v_new_off_f);
                    TYPE v_new_off_round = (TYPE)(v_new_off_f + (FLOATTYPE)0.5);
                    if (!is_decimal && v_new_off_floor < v_new_off_round)
                        v_new = v_min + v_new_off_round;
                    else
                        v_new = v_min + v_new_off_floor;
                }
            }

            // Round to user desired precision based on format string
            v_new = RoundScalarWithFormatT<TYPE,SIGNEDTYPE>(format, data_type, v_new);

            // Apply result
            if (*v != v_new)
            {
                *v = v_new;
                value_changed = true;
            }
        }
    }

    if (slider_sz < 1.0f)
    {
        *out_grab_bb = ImRect(bb.Min, bb.Min);
    }
    else
    {
        // Output grab position so it can be displayed by the caller
        float grab_t = SliderCalcRatioFromValueT<TYPE, FLOATTYPE>(data_type, *v, v_min, v_max, power, linear_zero_pos);
        if (axis == ImGuiAxis_Y)
            grab_t = 1.0f - grab_t;
        const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
        if (axis == ImGuiAxis_X)
            *out_grab_bb = ImRect(grab_pos - grab_sz * 0.5f, bb.Min.y + grab_padding, grab_pos + grab_sz * 0.5f, bb.Max.y - grab_padding);
        else
            *out_grab_bb = ImRect(bb.Min.x + grab_padding, grab_pos - grab_sz * 0.5f, bb.Max.x - grab_padding, grab_pos + grab_sz * 0.5f);
    }

    return value_changed;
}